

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O3

int gz_avail(gz_statep state)

{
  int iVar1;
  
  iVar1 = -1;
  if (state->err == 0) {
    if (state->eof == 0) {
      iVar1 = gz_load(state,state->in,state->size,&(state->strm).avail_in);
      if (iVar1 == -1) {
        return -1;
      }
      (state->strm).next_in = state->in;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

local int gz_avail(gz_statep state)
{
    z_streamp strm = &(state->strm);

    if (state->err != Z_OK)
        return -1;
    if (state->eof == 0) {
        if (gz_load(state, state->in, state->size,
                (unsigned *)&(strm->avail_in)) == -1)
            return -1;
        strm->next_in = state->in;
    }
    return 0;
}